

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)57,(moira::Mode)6,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  UInt u;
  Ea<(moira::Mode)6,_4> dst;
  Ea<(moira::Mode)6,_4> local_44;
  
  *addr = *addr + 2;
  iVar3 = (*this->_vptr_Moira[6])();
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])(this);
  u.raw = uVar4 & 0xffff | iVar3 << 0x10;
  Op<(moira::Mode)6,4>(&local_44,this,op & 7,addr);
  if (str->style->syntax == MUSASHI) {
    cVar2 = 'e';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar2;
      cVar2 = "eori"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    pcVar5 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar5 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar5 = '.';
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
    }
    *pcVar5 = 'l';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar3 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar3);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,u);
    pcVar5 = str->ptr;
    str->ptr = pcVar5 + 1;
    *pcVar5 = ',';
    SVar1 = str->style->syntax;
    if ((MUSASHI < SVar1) || (cVar2 = ' ', (0x13U >> (SVar1 & 0x1f) & 1) == 0)) goto LAB_0020ddff;
  }
  else {
    cVar2 = 'e';
    lVar6 = 0;
    do {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = cVar2;
      cVar2 = "eori"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    pcVar5 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar5 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar5 = '.';
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
    }
    *pcVar5 = 'l';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = str->ptr;
      str->ptr = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = str->ptr;
    }
    else {
      iVar3 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar3);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(Int)u.raw);
    cVar2 = ',';
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = cVar2;
LAB_0020ddff:
  StrWriter::operator<<(str,&local_44);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (str.style.syntax == Syntax::MUSASHI) {
        str << Ins<I>{} << Sz<S>{} << str.tab << Imu<S>{src} << Sep{} << dst;
    } else {
        str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << "," << dst;
    }
}